

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O1

void __thiscall
Centaurus::ATNMachine<char>::filter_nodes
          (ATNMachine<char> *this,vector<bool,_std::allocator<bool>_> *mask)

{
  int iVar1;
  ATNTransition<char> *pAVar2;
  pointer pAVar3;
  pointer pAVar4;
  ulong uVar5;
  ulong uVar6;
  ATNTransition<char> *t;
  ATNTransition<char> *__args;
  pointer pAVar7;
  ulong uVar8;
  vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_> nodes;
  vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_> filtered;
  vector<int,_std::allocator<int>_> index_map;
  int local_12c;
  vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_> local_128;
  vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_> local_108
  ;
  ATNMachine<char> *local_f0;
  long local_e8;
  vector<int,_std::allocator<int>_> local_e0;
  ATNNode<char> local_c8;
  
  local_128.super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_e0,
             ((long)(this->m_nodes).
                    super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_nodes).
                    super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x79435e50d79435e5,
             (allocator_type *)&local_c8);
  if (((long)(this->m_nodes).
             super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->m_nodes).
             super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x79435e50d79435e5 -
      ((ulong)(mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_offset +
      ((long)(mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)(mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8) != 0) {
    __assert_fail("m_nodes.size() == mask.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/ATN.hpp"
                  ,0x148,
                  "void Centaurus::ATNMachine<char>::filter_nodes(const std::vector<bool> &) [TCHAR = char]"
                 );
  }
  local_c8._vptr_ATNNode =
       (_func_int **)
       (this->m_nodes).
       super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_c8.m_transitions.
  super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(this->m_nodes).
                super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  pAVar3 = local_128.
           super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (local_c8.m_transitions.
      super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)local_c8._vptr_ATNNode) {
    uVar8 = 0;
    local_12c = 0;
    local_f0 = this;
    do {
      if (((mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0) {
        local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar8] = -1;
      }
      else {
        local_108.
        super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_108.
        super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (ATNTransition<char> *)0x0;
        local_108.
        super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (ATNTransition<char> *)0x0;
        local_e8 = uVar8 * 0x98;
        pAVar2 = (((pointer)((long)local_c8._vptr_ATNNode + uVar8 * 0x98))->m_transitions).
                 super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (__args = (((pointer)((long)local_c8._vptr_ATNNode + uVar8 * 0x98))->m_transitions).
                      super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; this = local_f0, __args != pAVar2;
            __args = __args + 1) {
          uVar5 = (ulong)__args->m_dest;
          uVar6 = uVar5 + 0x3f;
          if (-1 < (long)uVar5) {
            uVar6 = uVar5;
          }
          if (((mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p
               [((long)uVar6 >> 6) +
                (ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
               (uVar5 & 0x3f) & 1) != 0) {
            if (local_108.
                super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_108.
                super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<Centaurus::ATNTransition<char>,std::allocator<Centaurus::ATNTransition<char>>>
              ::_M_realloc_insert<Centaurus::ATNTransition<char>const&>
                        ((vector<Centaurus::ATNTransition<char>,std::allocator<Centaurus::ATNTransition<char>>>
                          *)&local_108,
                         (iterator)
                         local_108.
                         super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,__args);
            }
            else {
              (local_108.
               super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->_vptr_ATNTransition =
                   (_func_int **)&PTR__ATNTransition_00185a38;
              iVar1 = __args->m_dest;
              (local_108.
               super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->m_type = __args->m_type;
              (local_108.
               super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->m_dest = iVar1;
              (local_108.
               super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->m_tag = __args->m_tag;
              local_108.
              super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_108.
                   super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
        }
        pAVar3 = (local_f0->m_nodes).
                 super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar6 = ((long)(local_f0->m_nodes).
                       super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar3 >> 3) *
                -0x79435e50d79435e5;
        if (uVar6 < uVar8 || uVar6 - uVar8 == 0) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar8);
        }
        ATNNode<char>::ATNNode
                  (&local_c8,(ATNNode<char> *)((long)&pAVar3->_vptr_ATNNode + local_e8),&local_108);
        std::vector<Centaurus::ATNNode<char>,std::allocator<Centaurus::ATNNode<char>>>::
        emplace_back<Centaurus::ATNNode<char>>
                  ((vector<Centaurus::ATNNode<char>,std::allocator<Centaurus::ATNNode<char>>> *)
                   &local_128,&local_c8);
        ATNNode<char>::~ATNNode(&local_c8);
        local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar8] = local_12c;
        local_12c = local_12c + 1;
        std::
        vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>::
        ~vector(&local_108);
      }
      uVar8 = uVar8 + 1;
      local_c8._vptr_ATNNode =
           (_func_int **)
           (this->m_nodes).
           super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_c8.m_transitions.
      super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(this->m_nodes).
                    super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      uVar6 = ((long)local_c8.m_transitions.
                     super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
                     ._M_impl.super__Vector_impl_data._M_start - (long)local_c8._vptr_ATNNode >> 3)
              * -0x79435e50d79435e5;
      pAVar3 = local_128.
               super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 <= uVar6 && uVar6 - uVar8 != 0);
  }
  do {
    if (pAVar3 == local_128.
                  super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      local_c8.m_transitions.
      super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           *(pointer *)
            &((vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_> *)
             ((long)this + 0x18))->
             super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
      ;
      *(pointer *)
       &((vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_> *)
        ((long)this + 8))->
        super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_> =
           local_128.
           super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
      *(pointer *)
       &((vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_> *)
        ((long)this + 0x10))->
        super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_> =
           local_128.
           super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)
       &((vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_> *)
        ((long)this + 0x18))->
        super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_> =
           local_128.
           super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_128.
      super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.
      super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.
      super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::~vector
                ((vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_> *)
                 &local_c8);
      if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::~vector
                (&local_128);
      return;
    }
    pAVar4 = (pAVar3->m_transitions).
             super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pAVar7 = (pAVar3->m_transitions).
                  super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pAVar7 != pAVar4; pAVar7 = pAVar7 + 1)
    {
      iVar1 = *(int *)((long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + (long)pAVar7->m_dest * 4);
      if (iVar1 < 0) {
        __assert_fail("index_map[t.dest()] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/ATN.hpp"
                      ,0x164,
                      "void Centaurus::ATNMachine<char>::filter_nodes(const std::vector<bool> &) [TCHAR = char]"
                     );
      }
      pAVar7->m_dest = iVar1;
    }
    pAVar3 = pAVar3 + 1;
  } while( true );
}

Assistant:

void filter_nodes(const std::vector<bool>& mask)
    {
        std::vector<ATNNode<TCHAR> > nodes;
        std::vector<int> index_map(m_nodes.size());

        assert(m_nodes.size() == mask.size());

        for (int src_index = 0, dest_index = 0; src_index < m_nodes.size(); src_index++)
        {
            if (mask[src_index])
            {
                std::vector<ATNTransition<TCHAR> > filtered;
                for (const auto& t : m_nodes.at(src_index).get_transitions())
                {
                    if (mask[t.dest()])
                    {
                        filtered.push_back(t);
                    }
                }
                nodes.push_back(ATNNode<TCHAR>(m_nodes.at(src_index), std::move(filtered)));
                index_map[src_index] = dest_index;
                dest_index++;
            }
            else
            {
                index_map[src_index] = -1;
            }
        }

        for (auto& n : nodes)
        {
            for (auto& t : n.get_transitions())
            {
                assert(index_map[t.dest()] >= 0);

                t.dest(index_map[t.dest()]);
            }
        }
        m_nodes = std::move(nodes);
    }